

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS ref_smooth_tri_weighted_ideal_uv(REF_GRID ref_grid,REF_INT node,REF_DBL *ideal_uv)

{
  REF_DBL *pRVar1;
  uint uVar2;
  double local_118;
  REF_INT local_10c;
  double local_108;
  REF_INT local_100;
  int local_fc;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL normalization;
  REF_DBL weight;
  REF_DBL quality;
  REF_DBL target_q;
  REF_DBL tri_uv [2];
  int local_ac;
  REF_INT local_a8;
  REF_INT iuv;
  REF_INT nodes [27];
  REF_INT local_30;
  int local_2c;
  REF_INT cell;
  REF_INT item;
  REF_DBL *ideal_uv_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  _ref_private_macro_code_rss_1 = 0.0;
  for (local_ac = 0; local_ac < 2; local_ac = local_ac + 1) {
    ideal_uv[local_ac] = 0.0;
  }
  ref_grid_local._4_4_ = ref_smooth_tri_quality_around(ref_grid,node,&weight);
  if (ref_grid_local._4_4_ == 0) {
    quality = sqrt(weight);
    if ((node < 0) || (ref_grid->cell[3]->ref_adj->nnode <= node)) {
      local_fc = -1;
    }
    else {
      local_fc = ref_grid->cell[3]->ref_adj->first[node];
    }
    local_2c = local_fc;
    if (local_fc == -1) {
      local_100 = -1;
    }
    else {
      local_100 = ref_grid->cell[3]->ref_adj->item[local_fc].ref;
    }
    local_30 = local_100;
    while (local_2c != -1) {
      uVar2 = ref_smooth_tri_ideal_uv(ref_grid,node,local_30,&target_q,quality);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x299,"ref_smooth_tri_weighted_ideal_uv",(ulong)uVar2,"tri ideal");
        return uVar2;
      }
      uVar2 = ref_cell_nodes(ref_grid->cell[3],local_30,&local_a8);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x29a,"ref_smooth_tri_weighted_ideal_uv",(ulong)uVar2,"nodes");
        return uVar2;
      }
      uVar2 = ref_node_tri_quality(ref_grid->node,&local_a8,&weight);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x29c,"ref_smooth_tri_weighted_ideal_uv",(ulong)uVar2,"tri qual");
        return uVar2;
      }
      pRVar1 = &ref_grid->adapt->smooth_min_quality;
      if (weight < *pRVar1 || weight == *pRVar1) {
        local_108 = ref_grid->adapt->smooth_min_quality;
      }
      else {
        local_108 = weight;
      }
      weight = local_108;
      _ref_private_macro_code_rss_1 = 1.0 / local_108 + _ref_private_macro_code_rss_1;
      for (local_ac = 0; local_ac < 2; local_ac = local_ac + 1) {
        ideal_uv[local_ac] = (1.0 / local_108) * tri_uv[(long)local_ac + -1] + ideal_uv[local_ac];
      }
      local_2c = ref_grid->cell[3]->ref_adj->item[local_2c].next;
      if (local_2c == -1) {
        local_10c = -1;
      }
      else {
        local_10c = ref_grid->cell[3]->ref_adj->item[local_2c].ref;
      }
      local_30 = local_10c;
    }
    if (_ref_private_macro_code_rss_1 * 1e+20 <= 0.0) {
      local_118 = -(_ref_private_macro_code_rss_1 * 1e+20);
    }
    else {
      local_118 = _ref_private_macro_code_rss_1 * 1e+20;
    }
    if (local_118 <= 1.0) {
      printf("normalization = %e\n",_ref_private_macro_code_rss_1);
      ref_grid_local._4_4_ = 4;
    }
    else {
      for (local_ac = 0; local_ac < 2; local_ac = local_ac + 1) {
        ideal_uv[local_ac] = (1.0 / _ref_private_macro_code_rss_1) * ideal_uv[local_ac];
      }
      ref_grid_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x294,
           "ref_smooth_tri_weighted_ideal_uv",(ulong)ref_grid_local._4_4_,"q");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_tri_weighted_ideal_uv(REF_GRID ref_grid,
                                                           REF_INT node,
                                                           REF_DBL *ideal_uv) {
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT iuv;
  REF_DBL tri_uv[2];
  REF_DBL target_q, quality, weight, normalization;

  normalization = 0.0;
  for (iuv = 0; iuv < 2; iuv++) ideal_uv[iuv] = 0.0;

  RSS(ref_smooth_tri_quality_around(ref_grid, node, &quality), "q");
  target_q = sqrt(quality);

  each_ref_cell_having_node(ref_grid_tri(ref_grid), node, item, cell) {
    RSS(ref_smooth_tri_ideal_uv(ref_grid, node, cell, tri_uv, target_q),
        "tri ideal");
    RSS(ref_cell_nodes(ref_grid_tri(ref_grid), cell, nodes), "nodes");
    RSS(ref_node_tri_quality(ref_grid_node(ref_grid), nodes, &quality),
        "tri qual");
    quality = MAX(quality, ref_grid_adapt(ref_grid, smooth_min_quality));
    weight = 1.0 / quality;
    normalization += weight;
    for (iuv = 0; iuv < 2; iuv++) ideal_uv[iuv] += weight * tri_uv[iuv];
  }

  if (ref_math_divisible(1.0, normalization)) {
    for (iuv = 0; iuv < 2; iuv++)
      ideal_uv[iuv] = (1.0 / normalization) * ideal_uv[iuv];
  } else {
    printf("normalization = %e\n", normalization);
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}